

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  bool bVar1;
  mapped_type *pmVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  double ut;
  int i;
  int r;
  Rusage t;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  key_type *in_stack_fffffffffffffd58;
  _Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true> in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  _Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true> local_280 [12];
  size_t in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  double in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  _Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true> local_178 [33];
  int local_6c;
  uint local_68;
  vector<int,_std::allocator<int>_> *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e22eb);
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffd60._M_cur);
  for (local_6c = 0; local_6c < local_4; local_6c = local_6c + 1) {
    in_stack_fffffffffffffd74 = local_6c + 1;
    HashObject<256,_32>::HashObject
              ((HashObject<256,_32> *)in_stack_fffffffffffffd60._M_cur,
               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    pmVar2 = std::
             unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ::operator[]((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           *)in_stack_fffffffffffffd60._M_cur,in_stack_fffffffffffffd58);
    *pmVar2 = in_stack_fffffffffffffd74;
  }
  local_68 = 1;
  Rusage::Reset((Rusage *)in_stack_fffffffffffffd60._M_cur);
  for (local_6c = 0; local_6c < local_4; local_6c = local_6c + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_6c);
    HashObject<256,_32>::HashObject
              ((HashObject<256,_32> *)in_stack_fffffffffffffd60._M_cur,
               (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    in_stack_fffffffffffffd60._M_cur =
         (__node_type *)
         std::
         unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
         ::find((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                 *)in_stack_fffffffffffffd58,(key_type *)0x1e23ff);
    local_178[0]._M_cur = in_stack_fffffffffffffd60._M_cur;
    local_280[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
         ::end((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                *)in_stack_fffffffffffffd58);
    bVar1 = std::__detail::operator!=(local_178,local_280);
    local_68 = bVar1 ^ local_68;
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  srand(local_68);
  report(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e24bb);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}